

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_do(connectdata *conn,_Bool *done)

{
  Curl_RtspReq CVar1;
  Curl_easy *data_00;
  void *pvVar2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  Curl_send_buffer *in;
  char *pcVar6;
  curl_off_t *local_180;
  char *local_160;
  size_t local_150;
  size_t local_148;
  char *local_140;
  char *local_130;
  char *local_120;
  char *local_110;
  char *local_100;
  char *local_f0;
  char *local_e0;
  char *local_d0;
  char *p_userpwd;
  char *p_proxyuserpwd;
  char *p_uagent;
  char *p_transport;
  char *p_stream_uri;
  char *p_referrer;
  char *p_range;
  char *p_accept_encoding;
  char *p_accept;
  char *p_session_id;
  char *p_request;
  curl_off_t putsize;
  curl_off_t postsize;
  Curl_send_buffer *req_buffer;
  HTTP *http;
  RTSP *rtsp;
  Curl_RtspReq rtspreq;
  CURLcode result;
  Curl_easy *data;
  _Bool *done_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  CVar1 = (data_00->set).rtspreq;
  pvVar2 = (data_00->req).protop;
  putsize = 0;
  p_request = (char *)0x0;
  p_accept_encoding = (char *)0x0;
  p_range = (char *)0x0;
  p_referrer = (char *)0x0;
  p_proxyuserpwd = (char *)0x0;
  *done = true;
  *(long *)((long)pvVar2 + 0x228) = (data_00->state).rtsp_next_client_CSeq;
  *(undefined8 *)((long)pvVar2 + 0x230) = 0;
  (data_00->set).opt_no_body = true;
  switch(CVar1) {
  case RTSPREQ_OPTIONS:
    p_session_id = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_session_id = "DESCRIBE";
    (data_00->set).opt_no_body = false;
    break;
  case RTSPREQ_ANNOUNCE:
    p_session_id = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_session_id = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_session_id = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_session_id = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_session_id = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    p_session_id = "GET_PARAMETER";
    (data_00->set).opt_no_body = false;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_session_id = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_session_id = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_session_id = "";
    (data_00->set).opt_no_body = false;
    break;
  case RTSPREQ_LAST:
    Curl_failf(data_00,"Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  default:
    Curl_failf(data_00,"Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (CVar1 == RTSPREQ_RECEIVE) {
    Curl_setup_transfer(conn,0,-1,true,(curl_off_t *)((long)pvVar2 + 0x28),-1,(curl_off_t *)0x0);
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    pcVar6 = (data_00->set).str[0x2f];
    if ((pcVar6 == (char *)0x0) && ((CVar1 & ~RTSPREQ_TEARDOWN) != RTSPREQ_NONE)) {
      Curl_failf(data_00,"Refusing to issue an RTSP request [%s] without a session ID.",p_session_id
                );
      conn_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
    else {
      if ((data_00->set).str[0x30] == (char *)0x0) {
        p_transport = "*";
      }
      else {
        p_transport = (data_00->set).str[0x30];
      }
      p_uagent = Curl_checkheaders(conn,"Transport");
      if ((CVar1 == RTSPREQ_SETUP) && (p_uagent == (char *)0x0)) {
        if ((data_00->set).str[0x31] == (char *)0x0) {
          Curl_failf(data_00,"Refusing to issue an RTSP SETUP without a Transport: header.");
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        (*Curl_cfree)((conn->allocptr).rtsp_transport);
        (conn->allocptr).rtsp_transport = (char *)0x0;
        pcVar5 = curl_maprintf("Transport: %s\r\n",(data_00->set).str[0x31]);
        (conn->allocptr).rtsp_transport = pcVar5;
        if ((conn->allocptr).rtsp_transport == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        p_uagent = (conn->allocptr).rtsp_transport;
      }
      if (CVar1 == RTSPREQ_DESCRIBE) {
        pcVar5 = Curl_checkheaders(conn,"Accept");
        p_accept_encoding = "Accept: application/sdp\r\n";
        if (pcVar5 != (char *)0x0) {
          p_accept_encoding = (char *)0x0;
        }
        pcVar5 = Curl_checkheaders(conn,"Accept-Encoding");
        if ((pcVar5 == (char *)0x0) && ((data_00->set).str[9] != (char *)0x0)) {
          (*Curl_cfree)((conn->allocptr).accept_encoding);
          (conn->allocptr).accept_encoding = (char *)0x0;
          pcVar5 = curl_maprintf("Accept-Encoding: %s\r\n",(data_00->set).str[9]);
          (conn->allocptr).accept_encoding = pcVar5;
          if ((conn->allocptr).accept_encoding == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          p_range = (conn->allocptr).accept_encoding;
        }
      }
      pcVar5 = Curl_checkheaders(conn,"User-Agent");
      if ((pcVar5 == (char *)0x0) || ((conn->allocptr).uagent == (char *)0x0)) {
        pcVar5 = Curl_checkheaders(conn,"User-Agent");
        if ((pcVar5 == (char *)0x0) && ((data_00->set).str[0x24] != (char *)0x0)) {
          p_proxyuserpwd = (conn->allocptr).uagent;
        }
      }
      else {
        (*Curl_cfree)((conn->allocptr).uagent);
        (conn->allocptr).uagent = (char *)0x0;
        (conn->allocptr).uagent = (char *)0x0;
      }
      conn_local._4_4_ = Curl_http_output_auth(conn,p_session_id,p_transport,false);
      if (conn_local._4_4_ == CURLE_OK) {
        local_130 = (conn->allocptr).proxyuserpwd;
        local_140 = (conn->allocptr).userpwd;
        (*Curl_cfree)((conn->allocptr).ref);
        (conn->allocptr).ref = (char *)0x0;
        if (((data_00->change).referer == (char *)0x0) ||
           (pcVar5 = Curl_checkheaders(conn,"Referer"), pcVar5 != (char *)0x0)) {
          (conn->allocptr).ref = (char *)0x0;
        }
        else {
          pcVar5 = curl_maprintf("Referer: %s\r\n",(data_00->change).referer);
          (conn->allocptr).ref = pcVar5;
        }
        local_110 = (conn->allocptr).ref;
        if ((((((data_00->state).use_range & 1U) != 0) &&
             ((CVar1 & (RTSPREQ_LAST|RTSPREQ_ANNOUNCE)) != RTSPREQ_NONE)) &&
            (pcVar5 = Curl_checkheaders(conn,"Range"), pcVar5 == (char *)0x0)) &&
           ((data_00->state).range != (char *)0x0)) {
          (*Curl_cfree)((conn->allocptr).rangeline);
          (conn->allocptr).rangeline = (char *)0x0;
          pcVar5 = curl_maprintf("Range: %s\r\n",(data_00->state).range);
          (conn->allocptr).rangeline = pcVar5;
          p_referrer = (conn->allocptr).rangeline;
        }
        pcVar5 = Curl_checkheaders(conn,"CSeq");
        if (pcVar5 == (char *)0x0) {
          pcVar5 = Curl_checkheaders(conn,"Session");
          if (pcVar5 == (char *)0x0) {
            in = Curl_add_buffer_init();
            if (in == (Curl_send_buffer *)0x0) {
              conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              conn_local._4_4_ =
                   Curl_add_bufferf(in,"%s %s RTSP/1.0\r\nCSeq: %ld\r\n",p_session_id,p_transport,
                                    *(undefined8 *)((long)pvVar2 + 0x228));
              if ((conn_local._4_4_ == CURLE_OK) &&
                 ((pcVar6 == (char *)0x0 ||
                  (conn_local._4_4_ = Curl_add_bufferf(in,"Session: %s\r\n",pcVar6),
                  conn_local._4_4_ == CURLE_OK)))) {
                if (p_uagent == (char *)0x0) {
                  local_d0 = "";
                }
                else {
                  local_d0 = p_uagent;
                }
                if (p_accept_encoding == (char *)0x0) {
                  local_e0 = "";
                }
                else {
                  local_e0 = p_accept_encoding;
                }
                if (p_range == (char *)0x0) {
                  local_f0 = "";
                }
                else {
                  local_f0 = p_range;
                }
                if (p_referrer == (char *)0x0) {
                  local_100 = "";
                }
                else {
                  local_100 = p_referrer;
                }
                if (local_110 == (char *)0x0) {
                  local_110 = "";
                }
                if (p_proxyuserpwd == (char *)0x0) {
                  local_120 = "";
                }
                else {
                  local_120 = p_proxyuserpwd;
                }
                if (local_130 == (char *)0x0) {
                  local_130 = "";
                }
                if (local_140 == (char *)0x0) {
                  local_140 = "";
                }
                conn_local._4_4_ =
                     Curl_add_bufferf(in,"%s%s%s%s%s%s%s%s",local_d0,local_e0,local_f0,local_100,
                                      local_110,local_120,local_130,local_140);
                (*Curl_cfree)((conn->allocptr).userpwd);
                (conn->allocptr).userpwd = (char *)0x0;
                (conn->allocptr).userpwd = (char *)0x0;
                if ((conn_local._4_4_ == CURLE_OK) &&
                   ((((CVar1 != RTSPREQ_SETUP && (CVar1 != RTSPREQ_DESCRIBE)) ||
                     (conn_local._4_4_ = Curl_add_timecondition(data_00,in),
                     conn_local._4_4_ == CURLE_OK)) &&
                    (conn_local._4_4_ = Curl_add_custom_headers(conn,false,in),
                    conn_local._4_4_ == CURLE_OK)))) {
                  if (((CVar1 == RTSPREQ_ANNOUNCE) || (CVar1 == RTSPREQ_SET_PARAMETER)) ||
                     (CVar1 == RTSPREQ_GET_PARAMETER)) {
                    if (((data_00->set).upload & 1U) == 0) {
                      if ((data_00->state).infilesize == -1) {
                        if ((data_00->set).postfields == (void *)0x0) {
                          local_150 = 0;
                        }
                        else {
                          local_150 = strlen((char *)(data_00->set).postfields);
                        }
                        local_148 = local_150;
                      }
                      else {
                        local_148 = (data_00->state).infilesize;
                      }
                      putsize = local_148;
                      (data_00->set).httpreq = HTTPREQ_POST;
                    }
                    else {
                      p_request = (char *)(data_00->state).infilesize;
                      (data_00->set).httpreq = HTTPREQ_PUT;
                    }
                    if (((long)p_request < 1) && (putsize < 1)) {
                      if (CVar1 == RTSPREQ_GET_PARAMETER) {
                        (data_00->set).httpreq = HTTPREQ_HEAD;
                        (data_00->set).opt_no_body = true;
                      }
                    }
                    else {
                      pcVar6 = Curl_checkheaders(conn,"Content-Length");
                      if (pcVar6 == (char *)0x0) {
                        if (((data_00->set).upload & 1U) == 0) {
                          local_160 = (char *)putsize;
                        }
                        else {
                          local_160 = p_request;
                        }
                        CVar3 = Curl_add_bufferf(in,"Content-Length: %ld\r\n",local_160);
                        if (CVar3 != CURLE_OK) {
                          return CVar3;
                        }
                      }
                      if (((CVar1 == RTSPREQ_SET_PARAMETER) || (CVar1 == RTSPREQ_GET_PARAMETER)) &&
                         ((pcVar6 = Curl_checkheaders(conn,"Content-Type"), pcVar6 == (char *)0x0 &&
                          (CVar3 = Curl_add_bufferf(in,"Content-Type: text/parameters\r\n"),
                          CVar3 != CURLE_OK)))) {
                        return CVar3;
                      }
                      if (((CVar1 == RTSPREQ_ANNOUNCE) &&
                          (pcVar6 = Curl_checkheaders(conn,"Content-Type"), pcVar6 == (char *)0x0))
                         && (CVar3 = Curl_add_bufferf(in,"Content-Type: application/sdp\r\n"),
                            CVar3 != CURLE_OK)) {
                        return CVar3;
                      }
                      (data_00->state).expect100header = false;
                    }
                  }
                  (data_00->req).forbidchunk = true;
                  conn_local._4_4_ = Curl_add_buffer(in,"\r\n",2);
                  if ((conn_local._4_4_ == CURLE_OK) &&
                     ((putsize < 1 ||
                      (conn_local._4_4_ = Curl_add_buffer(in,(data_00->set).postfields,putsize),
                      conn_local._4_4_ == CURLE_OK)))) {
                    rtsp._4_4_ = Curl_add_buffer_send(in,conn,&(data_00->info).request_size,0,0);
                    if (rtsp._4_4_ == CURLE_OK) {
                      iVar4 = -1;
                      if (p_request == (char *)0x0) {
                        local_180 = (curl_off_t *)0x0;
                      }
                      else {
                        iVar4 = 0;
                        local_180 = (curl_off_t *)((long)pvVar2 + 0x30);
                      }
                      Curl_setup_transfer(conn,0,-1,true,(curl_off_t *)((long)pvVar2 + 0x28),iVar4,
                                          local_180);
                      (data_00->state).rtsp_next_client_CSeq =
                           (data_00->state).rtsp_next_client_CSeq + 1;
                      if (*(long *)((long)pvVar2 + 0x30) != 0) {
                        Curl_pgrsSetUploadCounter(data_00,*(curl_off_t *)((long)pvVar2 + 0x30));
                        iVar4 = Curl_pgrsUpdate(conn);
                        if (iVar4 != 0) {
                          rtsp._4_4_ = CURLE_ABORTED_BY_CALLBACK;
                        }
                      }
                      conn_local._4_4_ = rtsp._4_4_;
                    }
                    else {
                      Curl_failf(data_00,"Failed sending RTSP request");
                      conn_local._4_4_ = rtsp._4_4_;
                    }
                  }
                }
              }
            }
          }
          else {
            Curl_failf(data_00,"Session ID cannot be set as a custom header.");
            conn_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
          }
        }
        else {
          Curl_failf(data_00,"CSeq cannot be set as a custom header.");
          conn_local._4_4_ = CURLE_RTSP_CSEQ_ERROR;
        }
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode rtsp_do(struct connectdata *conn, bool *done)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  Curl_RtspReq rtspreq = data->set.rtspreq;
  struct RTSP *rtsp = data->req.protop;
  struct HTTP *http;
  Curl_send_buffer *req_buffer;
  curl_off_t postsize = 0; /* for ANNOUNCE and SET_PARAMETER */
  curl_off_t putsize = 0; /* for ANNOUNCE and SET_PARAMETER */

  const char *p_request = NULL;
  const char *p_session_id = NULL;
  const char *p_accept = NULL;
  const char *p_accept_encoding = NULL;
  const char *p_range = NULL;
  const char *p_referrer = NULL;
  const char *p_stream_uri = NULL;
  const char *p_transport = NULL;
  const char *p_uagent = NULL;
  const char *p_proxyuserpwd = NULL;
  const char *p_userpwd = NULL;

  *done = TRUE;

  http = &(rtsp->http_wrapper);
  /* Assert that no one has changed the RTSP struct in an evil way */
  DEBUGASSERT((void *)http == (void *)rtsp);

  rtsp->CSeq_sent = data->state.rtsp_next_client_CSeq;
  rtsp->CSeq_recv = 0;

  /* Setup the 'p_request' pointer to the proper p_request string
   * Since all RTSP requests are included here, there is no need to
   * support custom requests like HTTP.
   **/
  data->set.opt_no_body = TRUE; /* most requests don't contain a body */
  switch(rtspreq) {
  default:
    failf(data, "Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  case RTSPREQ_OPTIONS:
    p_request = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_request = "DESCRIBE";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_ANNOUNCE:
    p_request = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_request = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_request = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_request = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_request = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    /* GET_PARAMETER's no_body status is determined later */
    p_request = "GET_PARAMETER";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_request = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_request = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_request = "";
    /* Treat interleaved RTP as body*/
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_LAST:
    failf(data, "Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  if(rtspreq == RTSPREQ_RECEIVE) {
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE,
                        &http->readbytecount, -1, NULL);

    return result;
  }

  p_session_id = data->set.str[STRING_RTSP_SESSION_ID];
  if(!p_session_id &&
     (rtspreq & ~(RTSPREQ_OPTIONS | RTSPREQ_DESCRIBE | RTSPREQ_SETUP))) {
    failf(data, "Refusing to issue an RTSP request [%s] without a session ID.",
          p_request);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* TODO: proxy? */

  /* Stream URI. Default to server '*' if not specified */
  if(data->set.str[STRING_RTSP_STREAM_URI]) {
    p_stream_uri = data->set.str[STRING_RTSP_STREAM_URI];
  }
  else {
    p_stream_uri = "*";
  }

  /* Transport Header for SETUP requests */
  p_transport = Curl_checkheaders(conn, "Transport");
  if(rtspreq == RTSPREQ_SETUP && !p_transport) {
    /* New Transport: setting? */
    if(data->set.str[STRING_RTSP_TRANSPORT]) {
      Curl_safefree(conn->allocptr.rtsp_transport);

      conn->allocptr.rtsp_transport =
        aprintf("Transport: %s\r\n",
                data->set.str[STRING_RTSP_TRANSPORT]);
      if(!conn->allocptr.rtsp_transport)
        return CURLE_OUT_OF_MEMORY;
    }
    else {
      failf(data,
            "Refusing to issue an RTSP SETUP without a Transport: header.");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }

    p_transport = conn->allocptr.rtsp_transport;
  }

  /* Accept Headers for DESCRIBE requests */
  if(rtspreq == RTSPREQ_DESCRIBE) {
    /* Accept Header */
    p_accept = Curl_checkheaders(conn, "Accept")?
      NULL:"Accept: application/sdp\r\n";

    /* Accept-Encoding header */
    if(!Curl_checkheaders(conn, "Accept-Encoding") &&
       data->set.str[STRING_ENCODING]) {
      Curl_safefree(conn->allocptr.accept_encoding);
      conn->allocptr.accept_encoding =
        aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);

      if(!conn->allocptr.accept_encoding)
        return CURLE_OUT_OF_MEMORY;

      p_accept_encoding = conn->allocptr.accept_encoding;
    }
  }

  /* The User-Agent string might have been allocated in url.c already, because
     it might have been used in the proxy connect, but if we have got a header
     with the user-agent string specified, we erase the previously made string
     here. */
  if(Curl_checkheaders(conn, "User-Agent") && conn->allocptr.uagent) {
    Curl_safefree(conn->allocptr.uagent);
    conn->allocptr.uagent = NULL;
  }
  else if(!Curl_checkheaders(conn, "User-Agent") &&
          data->set.str[STRING_USERAGENT]) {
    p_uagent = conn->allocptr.uagent;
  }

  /* setup the authentication headers */
  result = Curl_http_output_auth(conn, p_request, p_stream_uri, FALSE);
  if(result)
    return result;

  p_proxyuserpwd = conn->allocptr.proxyuserpwd;
  p_userpwd = conn->allocptr.userpwd;

  /* Referrer */
  Curl_safefree(conn->allocptr.ref);
  if(data->change.referer && !Curl_checkheaders(conn, "Referer"))
    conn->allocptr.ref = aprintf("Referer: %s\r\n", data->change.referer);
  else
    conn->allocptr.ref = NULL;

  p_referrer = conn->allocptr.ref;

  /*
   * Range Header
   * Only applies to PLAY, PAUSE, RECORD
   *
   * Go ahead and use the Range stuff supplied for HTTP
   */
  if(data->state.use_range &&
     (rtspreq  & (RTSPREQ_PLAY | RTSPREQ_PAUSE | RTSPREQ_RECORD))) {

    /* Check to see if there is a range set in the custom headers */
    if(!Curl_checkheaders(conn, "Range") && data->state.range) {
      Curl_safefree(conn->allocptr.rangeline);
      conn->allocptr.rangeline = aprintf("Range: %s\r\n", data->state.range);
      p_range = conn->allocptr.rangeline;
    }
  }

  /*
   * Sanity check the custom headers
   */
  if(Curl_checkheaders(conn, "CSeq")) {
    failf(data, "CSeq cannot be set as a custom header.");
    return CURLE_RTSP_CSEQ_ERROR;
  }
  if(Curl_checkheaders(conn, "Session")) {
    failf(data, "Session ID cannot be set as a custom header.");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* Initialize a dynamic send buffer */
  req_buffer = Curl_add_buffer_init();

  if(!req_buffer)
    return CURLE_OUT_OF_MEMORY;

  result =
    Curl_add_bufferf(req_buffer,
                     "%s %s RTSP/1.0\r\n" /* Request Stream-URI RTSP/1.0 */
                     "CSeq: %ld\r\n", /* CSeq */
                     p_request, p_stream_uri, rtsp->CSeq_sent);
  if(result)
    return result;

  /*
   * Rather than do a normal alloc line, keep the session_id unformatted
   * to make comparison easier
   */
  if(p_session_id) {
    result = Curl_add_bufferf(req_buffer, "Session: %s\r\n", p_session_id);
    if(result)
      return result;
  }

  /*
   * Shared HTTP-like options
   */
  result = Curl_add_bufferf(req_buffer,
                            "%s" /* transport */
                            "%s" /* accept */
                            "%s" /* accept-encoding */
                            "%s" /* range */
                            "%s" /* referrer */
                            "%s" /* user-agent */
                            "%s" /* proxyuserpwd */
                            "%s" /* userpwd */
                            ,
                            p_transport ? p_transport : "",
                            p_accept ? p_accept : "",
                            p_accept_encoding ? p_accept_encoding : "",
                            p_range ? p_range : "",
                            p_referrer ? p_referrer : "",
                            p_uagent ? p_uagent : "",
                            p_proxyuserpwd ? p_proxyuserpwd : "",
                            p_userpwd ? p_userpwd : "");

  /*
   * Free userpwd now --- cannot reuse this for Negotiate and possibly NTLM
   * with basic and digest, it will be freed anyway by the next request
   */
  Curl_safefree(conn->allocptr.userpwd);
  conn->allocptr.userpwd = NULL;

  if(result)
    return result;

  if((rtspreq == RTSPREQ_SETUP) || (rtspreq == RTSPREQ_DESCRIBE)) {
    result = Curl_add_timecondition(data, req_buffer);
    if(result)
      return result;
  }

  result = Curl_add_custom_headers(conn, FALSE, req_buffer);
  if(result)
    return result;

  if(rtspreq == RTSPREQ_ANNOUNCE ||
     rtspreq == RTSPREQ_SET_PARAMETER ||
     rtspreq == RTSPREQ_GET_PARAMETER) {

    if(data->set.upload) {
      putsize = data->state.infilesize;
      data->set.httpreq = HTTPREQ_PUT;

    }
    else {
      postsize = (data->state.infilesize != -1)?
        data->state.infilesize:
        (data->set.postfields? (curl_off_t)strlen(data->set.postfields):0);
      data->set.httpreq = HTTPREQ_POST;
    }

    if(putsize > 0 || postsize > 0) {
      /* As stated in the http comments, it is probably not wise to
       * actually set a custom Content-Length in the headers */
      if(!Curl_checkheaders(conn, "Content-Length")) {
        result = Curl_add_bufferf(req_buffer,
            "Content-Length: %" CURL_FORMAT_CURL_OFF_T"\r\n",
            (data->set.upload ? putsize : postsize));
        if(result)
          return result;
      }

      if(rtspreq == RTSPREQ_SET_PARAMETER ||
         rtspreq == RTSPREQ_GET_PARAMETER) {
        if(!Curl_checkheaders(conn, "Content-Type")) {
          result = Curl_add_bufferf(req_buffer,
              "Content-Type: text/parameters\r\n");
          if(result)
            return result;
        }
      }

      if(rtspreq == RTSPREQ_ANNOUNCE) {
        if(!Curl_checkheaders(conn, "Content-Type")) {
          result = Curl_add_bufferf(req_buffer,
              "Content-Type: application/sdp\r\n");
          if(result)
            return result;
        }
      }

      data->state.expect100header = FALSE; /* RTSP posts are simple/small */
    }
    else if(rtspreq == RTSPREQ_GET_PARAMETER) {
      /* Check for an empty GET_PARAMETER (heartbeat) request */
      data->set.httpreq = HTTPREQ_HEAD;
      data->set.opt_no_body = TRUE;
    }
  }

  /* RTSP never allows chunked transfer */
  data->req.forbidchunk = TRUE;
  /* Finish the request buffer */
  result = Curl_add_buffer(req_buffer, "\r\n", 2);
  if(result)
    return result;

  if(postsize > 0) {
    result = Curl_add_buffer(req_buffer, data->set.postfields,
                             (size_t)postsize);
    if(result)
      return result;
  }

  /* issue the request */
  result = Curl_add_buffer_send(req_buffer, conn,
                                &data->info.request_size, 0, FIRSTSOCKET);
  if(result) {
    failf(data, "Failed sending RTSP request");
    return result;
  }

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE, &http->readbytecount,
                      putsize?FIRSTSOCKET:-1,
                      putsize?&http->writebytecount:NULL);

  /* Increment the CSeq on success */
  data->state.rtsp_next_client_CSeq++;

  if(http->writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is
       noted properly */
    Curl_pgrsSetUploadCounter(data, http->writebytecount);
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  return result;
}